

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

ufile_error
set_http_options(http_options *opt,char *method,char *mime_type,char *bucket,char *key,char *query)

{
  ufile_config *puVar1;
  undefined8 uVar2;
  char *pcVar3;
  curl_slist *pcVar4;
  char *pcVar5;
  char *__ptr;
  ufile_error uVar6;
  
  puVar1 = _global_config;
  uVar2 = 0xfffffffe;
  if (_global_config == (ufile_config *)0x0) {
    pcVar3 = "global configuration has not been initialization yet.";
  }
  else if (*bucket == '\0') {
    pcVar3 = "bucket connot be empty";
  }
  else if (*key == '\0') {
    pcVar3 = "key connot be empty";
  }
  else {
    opt->header = (curl_slist *)0x0;
    if (*mime_type == '\0') {
      pcVar4 = (curl_slist *)0x0;
    }
    else {
      pcVar3 = ufile_strconcat("Content-Type: ",mime_type,0);
      pcVar4 = (curl_slist *)curl_slist_append(opt->header,pcVar3);
      opt->header = pcVar4;
      free(pcVar3);
      pcVar4 = opt->header;
    }
    pcVar4 = (curl_slist *)curl_slist_append(pcVar4,"User-Agent: UFile CSDK/2.0.0");
    opt->header = pcVar4;
    pcVar3 = "";
    pcVar5 = ufile_file_authorization
                       (puVar1->public_key,puVar1->private_key,method,bucket,key,mime_type,"","");
    __ptr = ufile_strconcat("Authorization: ",pcVar5,0);
    pcVar4 = (curl_slist *)curl_slist_append(opt->header,__ptr);
    opt->header = pcVar4;
    free(pcVar5);
    free(__ptr);
    pcVar5 = ufile_strconcat(method,0);
    opt->method = pcVar5;
    if (query == (char *)0x0) {
      pcVar5 = ufile_strconcat(bucket,".",puVar1->file_host,"/",key,0);
    }
    else {
      pcVar5 = ufile_strconcat(bucket,".",puVar1->file_host,"/",key,"?",query,0);
    }
    opt->url = pcVar5;
    uVar2 = 0;
  }
  uVar6.message = pcVar3;
  uVar6._0_8_ = uVar2;
  return uVar6;
}

Assistant:

struct ufile_error
set_http_options(struct http_options *opt, 
                 const char *method,
                 const char *mime_type,
                 const char *bucket,
                 const char *key,
                 const char *query) {
    struct ufile_error error = NO_ERROR;
    struct ufile_config *cfg = _global_config;

    if (cfg == NULL){
        error.code = UFILE_CONFIG_ERROR_CODE;
        error.message = "global configuration has not been initialization yet.";
        return error;
    }

    if(strlen(bucket) == 0){
        error.code = UFILE_CONFIG_ERROR_CODE;
        error.message = "bucket connot be empty";
        return error;
    }

    if(strlen(key) == 0){
        error.code = UFILE_CONFIG_ERROR_CODE;
        error.message = "key connot be empty";
        return error;
    }

    opt->header = NULL;
    char *buf;
    if (strlen(mime_type) != 0){
        buf = ufile_strconcat("Content-Type: ", mime_type, NULL);
        opt->header = curl_slist_append(opt->header, buf);
        free(buf);
    }
    opt->header = curl_slist_append(opt->header, "User-Agent: UFile CSDK/2.0.0");

    char *auth = ufile_file_authorization(cfg->public_key,cfg->private_key,method, bucket, key, mime_type,"","");
    buf = ufile_strconcat("Authorization: ", auth, NULL); 
    opt->header = curl_slist_append(opt->header, buf);
    free(auth); 
    free(buf);

    opt->method = ufile_strconcat(method, NULL);
    if(query != NULL){
        opt->url = ufile_strconcat(bucket, ".", cfg->file_host, "/", key, "?", query, NULL);
    }else{
        opt->url = ufile_strconcat(bucket, ".", cfg->file_host, "/", key, NULL);
    }

    return error;
}